

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

void vkt::tessellation::anon_unknown_0::TessCoordComponent::initPrograms
               (SourceCollections *programCollection,CaseDefinition caseDef)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  ProgramSources *pPVar5;
  ostream *poVar6;
  long lVar7;
  char *__s;
  ostringstream src;
  ostringstream src_2;
  undefined1 auStack_398 [8];
  undefined1 local_390 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  string local_368;
  SourceCollections *local_348;
  long *local_340;
  long local_338;
  long local_330 [2];
  long local_320 [14];
  ios_base local_2b0 [264];
  uint local_1a8;
  undefined4 uStack_1a4;
  value_type local_1a0 [3];
  ios_base local_138 [264];
  
  local_348 = programCollection;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x78);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) in  highp float in_v_attr;\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) out highp float in_tc_attr;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    in_tc_attr = in_v_attr;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  local_390._0_8_ = &local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"vert","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_348->glslSources,(string *)local_390);
  std::__cxx11::stringbuf::str();
  local_1a8 = 0;
  paVar1 = &local_1a0[0].field_2;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_368._M_dataplus._M_p,
             local_368._M_dataplus._M_p + local_368._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_1a8,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._0_8_ != &local_380) {
    operator_delete((void *)local_390._0_8_,local_380._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x78);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(vertices = 1) out;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) in highp float in_tc_attr[];\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    gl_TessLevelInner[0] = in_tc_attr[0];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    gl_TessLevelInner[1] = in_tc_attr[1];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  local_390._0_8_ = &local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"tesc","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_348->glslSources,(string *)local_390);
  std::__cxx11::stringbuf::str();
  local_1a8 = 3;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_368._M_dataplus._M_p,
             local_368._M_dataplus._M_p + local_368._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_1a8,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._0_8_ != &local_380) {
    operator_delete((void *)local_390._0_8_,local_380._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD) {
    lVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"    {\n",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"        float oneMinusComp        = 1.0 - gl_TessCoord.",0x37
                );
      pcVar3 = *(char **)((long)&DAT_00d2f190 + lVar7);
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar3,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"        sb_out.tessCoord[index].",0x20);
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar3,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320," = gl_TessCoord.",0x10);
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar3,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320," + oneMinusComp;\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"    }\n",6);
      lVar7 = lVar7 + 8;
    } while ((ulong)(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) * 8 + 0x10 != lVar7);
  }
  else {
    if (caseDef.caseType != CASETYPE_TESS_COORD_RANGE) goto LAB_00797d9a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"    sb_out.tessCoord[index] = gl_TessCoord;\n",0x2c);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x1f0);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"layout(",7);
  if (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar3 = "triangles";
LAB_007979dd:
    bVar2 = false;
  }
  else {
    if (caseDef.primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      pcVar3 = "isolines";
      goto LAB_007979dd;
    }
    if (caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS) {
      pcVar3 = "quads";
      goto LAB_007979dd;
    }
    bVar2 = true;
    pcVar3 = (char *)0x0;
  }
  if (bVar2) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x1f0);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  if (caseDef.spacingMode == SPACINGMODE_EQUAL) {
    pcVar3 = "equal_spacing";
LAB_00797a6c:
    bVar2 = false;
  }
  else {
    if (caseDef.spacingMode == SPACINGMODE_FRACTIONAL_EVEN) {
      pcVar3 = "fractional_even_spacing";
      goto LAB_00797a6c;
    }
    if (caseDef.spacingMode == SPACINGMODE_FRACTIONAL_ODD) {
      pcVar3 = "fractional_odd_spacing";
      goto LAB_00797a6c;
    }
    bVar2 = true;
    pcVar3 = (char *)0x0;
  }
  if (bVar2) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x1f0);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  pcVar3 = (char *)0x0;
  if (caseDef.winding == WINDING_CW) {
    pcVar3 = "cw";
  }
  __s = "ccw";
  if (caseDef.winding != WINDING_CCW) {
    __s = pcVar3;
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x1f0);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar4);
  }
  pcVar3 = "";
  if (caseDef.usePointMode != false) {
    pcVar3 = ", point_mode";
  }
  lVar7 = 0xc;
  if (caseDef.usePointMode == false) {
    lVar7 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar3,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n",0x47);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    int  numInvocations;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    vec3 tessCoord[];\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"} sb_out;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    int index = atomicAdd(sb_out.numInvocations, 1);\n",0x35);
  std::__cxx11::stringbuf::str();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,(char *)local_390._0_8_,local_390._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._0_8_ != &local_380) {
    operator_delete((void *)local_390._0_8_,local_380._M_allocated_capacity + 1);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"tese","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_348->glslSources,&local_368);
  std::__cxx11::stringbuf::str();
  local_390._0_4_ = 4;
  local_390._8_8_ = local_380._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_390 + 8),local_340,local_338 + (long)local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + (local_390._0_8_ & 0xffffffff),(value_type *)(local_390 + 8));
  if ((char *)local_390._8_8_ != local_380._M_local_buf + 8) {
    operator_delete((void *)local_390._8_8_,local_380._8_8_ + 1);
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00797d9a:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void initPrograms (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp float in_v_attr;\n"
			<< "layout(location = 0) out highp float in_tc_attr;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_attr = in_v_attr;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = 1) out;\n"
			<< "\n"
			<< "layout(location = 0) in highp float in_tc_attr[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = in_tc_attr[0];\n"
			<< "    gl_TessLevelInner[1] = in_tc_attr[1];\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = in_tc_attr[2];\n"
			<< "    gl_TessLevelOuter[1] = in_tc_attr[3];\n"
			<< "    gl_TessLevelOuter[2] = in_tc_attr[4];\n"
			<< "    gl_TessLevelOuter[3] = in_tc_attr[5];\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		std::ostringstream tessCoordSrc;

		if (caseDef.caseType == CASETYPE_TESS_COORD_RANGE)
			tessCoordSrc << "    sb_out.tessCoord[index] = gl_TessCoord;\n";
		else if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD)
		{
			const char* components[]  = { "x" , "y", "z" };
			const int   numComponents = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

			for (int i = 0; i < numComponents; ++i)
				tessCoordSrc << "    {\n"
							 << "        float oneMinusComp        = 1.0 - gl_TessCoord." << components[i] << ";\n"
							 << "        sb_out.tessCoord[index]." << components[i] << " = gl_TessCoord." << components[i] << " + oneMinusComp;\n"
							 << "    }\n";
		}
		else
		{
			DE_ASSERT(false);
			return;
		}

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
						 << getSpacingModeShaderName(caseDef.spacingMode) << ", "
						 << getWindingShaderName(caseDef.winding)
						 << (caseDef.usePointMode ? ", point_mode" : "") << ") in;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
			<< "    int  numInvocations;\n"
			<< "    vec3 tessCoord[];\n"
			<< "} sb_out;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    int index = atomicAdd(sb_out.numInvocations, 1);\n"
			<< tessCoordSrc.str()
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}
}